

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_resolveFlattenCircularImportsUnits_Test::
ModelFlattening_resolveFlattenCircularImportsUnits_Test
          (ModelFlattening_resolveFlattenCircularImportsUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0016a9b0;
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenCircularImportsUnits)
{
    const std::string resolveError =
        std::string("Cyclic dependencies were found when attempting to resolve units in the model 'importExampleUnits'. The dependency loop is:\n")
        + " - units 'sideB' specifies an import from ':this:' to '" + resourcePath("modelflattening/") + "circularImport1units.cellml';\n"
        + " - units 'shared' specifies an import from '" + resourcePath("modelflattening/") + "circularImport1units.cellml' to '" + resourcePath("modelflattening/") + "circularImport2units.cellml'; and\n"
        + " - units 'circular2' specifies an import from '" + resourcePath("modelflattening/") + "circularImport2units.cellml' to '" + resourcePath("modelflattening/") + "circularImport1units.cellml'.";

    const std::string flattenError =
        std::string("Cyclic dependencies were found when attempting to flatten units in the model 'importExampleUnits'. The dependency loop is:\n")
        + " - units 'sideB' specifies an import from ':this:' to '" + resourcePath("modelflattening/") + "circularImport1units.cellml';\n"
        + " - units 'shared' specifies an import from '" + resourcePath("modelflattening/") + "circularImport1units.cellml' to '" + resourcePath("modelflattening/") + "circularImport2units.cellml'; and\n"
        + " - units 'circular2' specifies an import from '" + resourcePath("modelflattening/") + "circularImport2units.cellml' to '" + resourcePath("modelflattening/") + "circularImport1units.cellml'.";

    auto parser = libcellml::Parser::create();
    auto originalModel = parser->parseModel(fileContents("modelflattening/importExampleUnits.cellml"));
    auto importer = libcellml::Importer::create();

    // Resolve the imports.
    importer->resolveImports(originalModel, resourcePath("modelflattening/"));

    // Check for issues: expect one reporting the circular import.
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(resolveError, importer->issue(0)->description());

    // Create a flattened version to demonstrate the diagnostics.
    auto flatModel = importer->flattenModel(originalModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(flattenError, importer->issue(0)->description());
    EXPECT_EQ(nullptr, flatModel);
}